

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPlugin.cpp
# Opt level: O1

void __thiscall MemoryReporterPlugin::removeGlobalMemoryReportAllocators(MemoryReporterPlugin *this)

{
  TestMemoryAllocator *pTVar1;
  
  pTVar1 = getCurrentNewAllocator();
  if ((MemoryReportAllocator *)pTVar1 == &this->newAllocator) {
    pTVar1 = MemoryReportAllocator::getRealAllocator(&this->newAllocator);
    setCurrentNewAllocator(pTVar1);
  }
  pTVar1 = getCurrentNewArrayAllocator();
  if ((MemoryReportAllocator *)pTVar1 == &this->newArrayAllocator) {
    pTVar1 = MemoryReportAllocator::getRealAllocator(&this->newArrayAllocator);
    setCurrentNewArrayAllocator(pTVar1);
  }
  pTVar1 = getCurrentMallocAllocator();
  if ((MemoryReportAllocator *)pTVar1 != &this->mallocAllocator) {
    return;
  }
  pTVar1 = MemoryReportAllocator::getRealAllocator(&this->mallocAllocator);
  setCurrentMallocAllocator(pTVar1);
  return;
}

Assistant:

void MemoryReporterPlugin::removeGlobalMemoryReportAllocators()
{
    if (getCurrentNewAllocator() == &newAllocator)
        setCurrentNewAllocator(newAllocator.getRealAllocator());

    if (getCurrentNewArrayAllocator() == &newArrayAllocator)
        setCurrentNewArrayAllocator(newArrayAllocator.getRealAllocator());

    if (getCurrentMallocAllocator() == &mallocAllocator)
        setCurrentMallocAllocator(mallocAllocator.getRealAllocator());
}